

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays
          (GeometryShaderPrimitiveCounterRestartingPrimitive *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ContextType CVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ulong uVar8;
  void *__s;
  uint uVar9;
  uint local_34;
  uint local_30;
  uint i;
  uint restartNr;
  uint restartIndex;
  uint nIndices;
  GLuint *indices;
  Functions *gl;
  GeometryShaderPrimitiveCounterRestartingPrimitive *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  uVar9 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.m_numberOfDrawnPrimitives
          * (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
            m_numberOfVerticesPerOneInputPrimitive + this->m_numberOfRestarts;
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context);
  CVar4.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  bVar2 = glu::isContextTypeES(CVar4);
  restartNr = uVar9;
  if (bVar2) {
    restartNr = 0xffffffff;
  }
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_id);
  (**(code **)(lVar7 + 0x40))(0x8893,this->m_bo_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not generate a buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x3f2);
  uVar8 = SUB168(ZEXT416(uVar9) * ZEXT816(4),0);
  if (SUB168(ZEXT416(uVar9) * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar8);
  memset(__s,0,(ulong)uVar9 << 2);
  for (local_30 = 0; local_30 < this->m_numberOfRestarts; local_30 = local_30 + 1) {
    local_34 = (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
               m_numberOfVerticesPerOneInputPrimitive * local_30;
    while (uVar1 = local_34, local_34 = uVar1 + 1, local_34 < uVar9) {
      if (local_34 <
          (this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
          m_numberOfVerticesPerOneInputPrimitive * (local_30 + 1) + local_30) {
        *(uint *)((long)__s + (ulong)local_34 * 4) = local_34 - local_30;
      }
      else if ((this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
               m_numberOfVerticesPerOneInputPrimitive * (local_30 + 1) + local_30 < local_34) {
        *(uint *)((long)__s + (ulong)local_34 * 4) = uVar1 - local_30;
      }
    }
    *(uint *)((long)__s +
             (ulong)((this->super_GeometryShaderPrimitiveCounter).m_testConfiguration.
                     m_numberOfVerticesPerOneInputPrimitive * (local_30 + 1) + local_30) * 4) =
         restartNr;
  }
  (**(code **)(lVar7 + 0x150))(0x8893,(ulong)uVar9 << 2,__s,0x88e4);
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Could not create element array buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                  ,0x418);
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context);
  CVar4.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  bVar2 = glu::isContextTypeES(CVar4);
  if (!bVar2) {
    (**(code **)(lVar7 + 0x1048))(restartNr);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Could not set primitive restart index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x41e);
  }
  return;
}

Assistant:

void GeometryShaderPrimitiveCounterRestartingPrimitive::setUpVertexAttributeArrays()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a buffer object to hold the element data */
	glw::GLuint*	   indices = DE_NULL;
	const unsigned int nIndices =
		m_testConfiguration.m_numberOfDrawnPrimitives * m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive +
		m_numberOfRestarts;
	unsigned int restartIndex;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		restartIndex = nIndices;
	}
	else
	{
		restartIndex = 0xFFFFFFFF;
	}

	gl.genBuffers(1, &m_bo_id);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate a buffer object");

	/* Prepare the data we will later use for configuring buffer object storage contents */
	indices = new unsigned int[nIndices];
	memset(indices, 0, nIndices * sizeof(unsigned int));

	for (unsigned int restartNr = 0; restartNr < m_numberOfRestarts; ++restartNr)
	{
		for (unsigned int i = m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * restartNr + 1; i < nIndices;
			 i++)
		{
			if (i < m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = i - restartNr;
			}
			else if (i > m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr)
			{
				indices[i] = (i - 1 - restartNr);
			}
		}
		indices[m_testConfiguration.m_numberOfVerticesPerOneInputPrimitive * (restartNr + 1) + restartNr] =
			restartIndex;
	}

	/*
	 m_testCtx.getLog() << tcu::TestLog::Message << "Indices table [ " << tcu::TestLog::EndMessage;
	 for (unsigned int i = 0; i < nIndices; i++)
	 {
	 m_testCtx.getLog() << tcu::TestLog::Message << indices[i] << ", " << tcu::TestLog::EndMessage;
	 }
	 m_testCtx.getLog() << tcu::TestLog::Message << " ]" << tcu::TestLog::EndMessage;
	 */

	/* Set up buffer object data storage */
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(glw::GLuint) * nIndices, indices, GL_STATIC_DRAW);
	/* Free the buffer we no longer need */
	delete[] indices;
	indices = NULL;
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create element array buffer object");

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up primitive restarting */
		gl.primitiveRestartIndex(restartIndex);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set primitive restart index");
	}
}